

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DistantLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               DistantLight *light,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr __k;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Rb_tree_header *p_Var4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  long *plVar9;
  const_iterator cVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  char *pcVar13;
  char *pcVar14;
  string *name;
  bool bVar15;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined1 local_2e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d0;
  string *local_2c0;
  string *local_2b8;
  string local_2b0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *local_290;
  TypedAttributeWithFallback<tinyusdz::Purpose> *local_288;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_250;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *local_248;
  _Base_ptr local_240;
  long *local_238 [2];
  long local_228 [2];
  undefined1 local_218 [16];
  code *local_208;
  code *pcStack_200;
  ios_base local_1a8 [272];
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_280._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_280._M_t._M_impl.super__Rb_tree_header._M_header;
  local_280._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar15 = false;
  local_280._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_280._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2c0 = warn;
  local_2b8 = err;
  local_280._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_280._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = ReconstructXformOpsFromProperties
                    (spec,&local_280,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,err);
  if (bVar6) {
    p_Var12 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_240 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    bVar15 = p_Var12 == local_240;
    if (!bVar15) {
      local_248 = &light->angle;
      local_250 = &(light->super_NonboundableLight).props;
      local_290 = &(light->super_NonboundableLight).visibility;
      local_288 = &(light->super_NonboundableLight).purpose;
      do {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,*(long *)(p_Var12 + 1),
                   (long)&(p_Var12[1]._M_parent)->_M_color + *(long *)(p_Var12 + 1));
        prop = (Property *)(p_Var12 + 2);
        name = (string *)local_218;
        local_218._0_8_ = &local_208;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)name,"inputs:angle","");
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_2e8,&local_280,&local_98,prop,name,local_248);
        if ((code **)local_218._0_8_ != &local_208) {
          operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        iVar7 = 0;
        if ((local_2e8._0_8_ & 0xfffffffd) == 0) {
          iVar7 = 3;
LAB_0021491b:
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if (local_2e8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
            poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xd1e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            local_238[0] = local_228;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[13],std::__cxx11::string>
                      (&local_2b0,(fmt *)local_238,(string *)"inputs:angle",
                       (char (*) [13])(local_2e8 + 8),name);
            poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_218,local_2b0._M_dataplus._M_p,
                                local_2b0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            paVar3 = &local_2b0.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != paVar3) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_238[0] != local_228) {
              operator_delete(local_238[0],local_228[0] + 1);
            }
            if (local_2b8 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar9 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_238,(ulong)(local_2b8->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2b0.field_2._M_allocated_capacity = *psVar1;
                local_2b0.field_2._8_8_ = plVar9[3];
                local_2b0._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_2b0.field_2._M_allocated_capacity = *psVar1;
                local_2b0._M_dataplus._M_p = (pointer)*plVar9;
              }
              local_2b0._M_string_length = plVar9[1];
              *plVar9 = (long)psVar1;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_2b8,(string *)&local_2b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0._M_dataplus._M_p != paVar3) {
                operator_delete(local_2b0._M_dataplus._M_p,
                                local_2b0.field_2._M_allocated_capacity + 1);
              }
              if (local_238[0] != local_228) {
                operator_delete(local_238[0],local_228[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
            ::std::ios_base::~ios_base(local_1a8);
            iVar7 = 1;
            goto LAB_0021491b;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._8_8_ != &aStack_2d0) {
          operator_delete((void *)local_2e8._8_8_,aStack_2d0._M_allocated_capacity + 1);
        }
        if (bVar6) {
          __k = p_Var12 + 1;
          iVar7 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar7 == 0) {
            local_218._0_8_ = &local_208;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"purpose","");
            cVar10 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_280,(key_type *)local_218);
            if ((code **)local_218._0_8_ != &local_208) {
              operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
            }
            iVar7 = 3;
            if ((_Rb_tree_header *)cVar10._M_node == &local_280._M_t._M_impl.super__Rb_tree_header)
            {
              if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                local_218._0_8_ = &local_208;
                local_218._8_8_ = 0;
                local_208 = (code *)((ulong)local_208 & 0xffffffffffffff00);
              }
              else {
                Attribute::type_name_abi_cxx11_((string *)local_218,(Attribute *)prop);
              }
              local_2e8._0_8_ = local_2e8 + 0x10;
              local_2e8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x5;
              local_2e8._16_6_ = 0x6e656b6f74;
              if (((local_218._8_8_ == 5) &&
                  (iVar7 = bcmp((void *)local_218._0_8_,local_2e8 + 0x10,5), iVar7 == 0)) &&
                 (uVar5 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar5 < 2)) {
                if ((code **)local_218._0_8_ != &local_208) {
                  operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
                }
                if (uVar5 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3)
                  ;
                  poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xd20);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"No value assigned to `",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"purpose",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218,"` token attribute. Set default token value.",0x2b
                            );
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\n",1);
                  if (local_2c0 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar9 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)&local_2b0,
                                                (ulong)(local_2b8->_M_dataplus)._M_p);
                    psVar1 = (size_type *)(plVar9 + 2);
                    if ((size_type *)*plVar9 == psVar1) {
                      local_2e8._16_8_ = *psVar1;
                      aStack_2d0._M_allocated_capacity = plVar9[3];
                      local_2e8._0_8_ = local_2e8 + 0x10;
                    }
                    else {
                      local_2e8._16_8_ = *psVar1;
                      local_2e8._0_8_ = (size_type *)*plVar9;
                    }
                    local_2e8._8_8_ = plVar9[1];
                    *plVar9 = (long)psVar1;
                    plVar9[1] = 0;
                    *(undefined1 *)(plVar9 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)local_2c0,(string *)local_2e8);
                    if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                      operator_delete(local_2b0._M_dataplus._M_p,
                                      local_2b0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                  ::std::ios_base::~ios_base(local_1a8);
                  AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var12 + 7));
                  pcVar14 = "purpose";
                  pcVar13 = "";
LAB_002156ae:
                  iVar7 = 3;
                  local_218._0_8_ = &local_208;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_218,pcVar14,pcVar13);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_280,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_218);
                  if ((code **)local_218._0_8_ != &local_208) {
                    operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
                  }
                  goto LAB_00215514;
                }
              }
              else if ((code **)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
              }
              local_218._8_8_ = 0;
              local_218._0_8_ = PurposeEnumHandler;
              pcStack_200 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
              local_208 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_manager;
              local_2e8._0_8_ = local_2e8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"purpose","");
              bVar6 = options->strict_allowedToken_check;
              local_48 = (code *)0x0;
              pcStack_40 = (code *)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              if (local_208 != (code *)0x0) {
                (*local_208)(&local_58,local_218,2);
                local_48 = local_208;
                pcStack_40 = pcStack_200;
              }
              bVar6 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                ((string *)local_2e8,bVar6,
                                 (EnumHandlerFun<tinyusdz::Purpose> *)&local_58,(Attribute *)prop,
                                 local_288,local_2c0,local_2b8);
              if (local_48 != (code *)0x0) {
                (*local_48)(&local_58,&local_58,__destroy_functor);
              }
              if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
              }
              iVar7 = 1;
              if (bVar6) {
                AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var12 + 7));
                pcVar14 = "purpose";
                pcVar13 = "";
LAB_0021543c:
                local_2e8._0_8_ = local_2e8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2e8,pcVar14,pcVar13);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_280,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8);
                if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                  operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
                }
                iVar7 = 3;
              }
LAB_0021546b:
              if (local_208 != (code *)0x0) {
                (*local_208)(local_218,local_218,3);
              }
            }
          }
          else {
            iVar7 = ::std::__cxx11::string::compare((char *)__k);
            if (iVar7 == 0) {
              local_218._0_8_ = &local_208;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"visibility","")
              ;
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_280,(key_type *)local_218);
              if ((code **)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
              }
              iVar7 = 3;
              if ((_Rb_tree_header *)cVar10._M_node == &local_280._M_t._M_impl.super__Rb_tree_header
                 ) {
                if (((ulong)p_Var12[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                  local_218._0_8_ = &local_208;
                  local_218._8_8_ = 0;
                  local_208 = (code *)((ulong)local_208 & 0xffffffffffffff00);
                }
                else {
                  Attribute::type_name_abi_cxx11_((string *)local_218,(Attribute *)prop);
                }
                local_2e8._0_8_ = local_2e8 + 0x10;
                local_2e8._8_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x5;
                local_2e8._16_6_ = 0x6e656b6f74;
                if (((local_218._8_8_ == 5) &&
                    (iVar7 = bcmp((void *)local_218._0_8_,local_2e8 + 0x10,5), iVar7 == 0)) &&
                   (uVar5 = *(uint *)((long)&p_Var12[0x17]._M_parent + 4), uVar5 < 2)) {
                  if ((code **)local_218._0_8_ != &local_208) {
                    operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
                  }
                  if (uVar5 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"():",3);
                    poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xd22)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"No value assigned to `",0x16);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"visibility",10);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"` token attribute. Set default token value.",
                               0x2b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218,"\n",1);
                    if (local_2c0 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar9 = (long *)::std::__cxx11::string::_M_append
                                                 ((char *)&local_2b0,
                                                  (ulong)(local_2b8->_M_dataplus)._M_p);
                      psVar1 = (size_type *)(plVar9 + 2);
                      if ((size_type *)*plVar9 == psVar1) {
                        local_2e8._16_8_ = *psVar1;
                        aStack_2d0._M_allocated_capacity = plVar9[3];
                        local_2e8._0_8_ = local_2e8 + 0x10;
                      }
                      else {
                        local_2e8._16_8_ = *psVar1;
                        local_2e8._0_8_ = (size_type *)*plVar9;
                      }
                      local_2e8._8_8_ = plVar9[1];
                      *plVar9 = (long)psVar1;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_2c0,(string *)local_2e8);
                      if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                        operator_delete(local_2b0._M_dataplus._M_p,
                                        local_2b0.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                    ::std::ios_base::~ios_base(local_1a8);
                    AttrMetas::operator=(&local_290->_metas,(AttrMetas *)(p_Var12 + 7));
                    pcVar14 = "visibility";
                    pcVar13 = "";
                    goto LAB_002156ae;
                  }
                }
                else if ((code **)local_218._0_8_ != &local_208) {
                  operator_delete((void *)local_218._0_8_,(ulong)((long)local_208 + 1));
                }
                local_218._8_8_ = 0;
                local_218._0_8_ = VisibilityEnumHandler;
                pcStack_200 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                local_208 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                local_2e8._0_8_ = local_2e8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_2e8,"visibility","");
                bVar6 = options->strict_allowedToken_check;
                local_68 = (code *)0x0;
                pcStack_60 = (code *)0x0;
                local_78._M_unused._M_object = (void *)0x0;
                local_78._8_8_ = 0;
                if (local_208 != (code *)0x0) {
                  (*local_208)(&local_78,local_218,2);
                  local_68 = local_208;
                  pcStack_60 = pcStack_200;
                }
                bVar6 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                  ((string *)local_2e8,bVar6,
                                   (EnumHandlerFun<tinyusdz::Visibility> *)&local_78,
                                   (Attribute *)prop,local_290,local_2c0,local_2b8);
                if (local_68 != (code *)0x0) {
                  (*local_68)(&local_78,&local_78,__destroy_functor);
                }
                if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
                  operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
                }
                iVar7 = 1;
                if (bVar6) {
                  AttrMetas::operator=(&local_290->_metas,(AttrMetas *)(p_Var12 + 7));
                  pcVar14 = "visibility";
                  pcVar13 = "";
                  goto LAB_0021543c;
                }
                goto LAB_0021546b;
              }
            }
            else {
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_280,(key_type *)__k);
              p_Var4 = &local_280._M_t._M_impl.super__Rb_tree_header;
              if ((_Rb_tree_header *)cVar10._M_node == p_Var4) {
                pmVar11 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                          ::operator[](local_250,(key_type *)__k);
                ::std::__cxx11::string::_M_assign((string *)pmVar11);
                (pmVar11->_attrib)._varying_authored = (bool)p_Var12[3].field_0x4;
                (pmVar11->_attrib)._variability = p_Var12[3]._M_color;
                ::std::__cxx11::string::_M_assign((string *)&(pmVar11->_attrib)._type_name);
                linb::any::operator=((any *)&(pmVar11->_attrib)._var,(any *)&p_Var12[4]._M_parent);
                (pmVar11->_attrib)._var._blocked = SUB41(p_Var12[5]._M_color,0);
                ::std::
                vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ::operator=(&(pmVar11->_attrib)._var._ts._samples,
                            (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                             *)&p_Var12[5]._M_parent);
                (pmVar11->_attrib)._var._ts._dirty = SUB41(p_Var12[6]._M_color,0);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar11->_attrib)._paths,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var12[6]._M_parent);
                AttrMetas::operator=(&(pmVar11->_attrib)._metas,(AttrMetas *)(p_Var12 + 7));
                *(_Base_ptr *)&pmVar11->_listOpQual = p_Var12[0x17]._M_parent;
                (pmVar11->_rel).type = *(Type *)&p_Var12[0x17]._M_left;
                Path::operator=(&(pmVar11->_rel).targetPath,(Path *)&p_Var12[0x17]._M_right);
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &(pmVar11->_rel).targetPathVector,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var12[0x1e]._M_parent);
                (pmVar11->_rel).listOpQual = p_Var12[0x1f]._M_color;
                AttrMetas::operator=(&(pmVar11->_rel)._metas,(AttrMetas *)&p_Var12[0x1f]._M_parent);
                (pmVar11->_rel)._varying_authored = *(bool *)&p_Var12[0x2f]._M_left;
                ::std::__cxx11::string::_M_assign((string *)&pmVar11->_prop_value_type_name);
                pmVar11->_has_custom = *(bool *)&p_Var12[0x30]._M_right;
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_280,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
                ;
              }
              cVar10 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_280,(key_type *)__k);
              iVar7 = 0;
              if ((_Rb_tree_header *)cVar10._M_node == p_Var4) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"():",3);
                poVar8 = (ostream *)::std::ostream::operator<<((ostringstream *)local_218,0xd24);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e8,"Unsupported/unimplemented property: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__k);
                poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_218,(char *)local_2e8._0_8_,local_2e8._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                psVar1 = (size_type *)(local_2e8 + 0x10);
                if ((size_type *)local_2e8._0_8_ != psVar1) {
                  operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
                }
                if (local_2c0 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar9 = (long *)::std::__cxx11::string::_M_append
                                             ((char *)&local_2b0,
                                              (ulong)(local_2b8->_M_dataplus)._M_p);
                  psVar2 = (size_type *)(plVar9 + 2);
                  if ((size_type *)*plVar9 == psVar2) {
                    local_2e8._16_8_ = *psVar2;
                    aStack_2d0._M_allocated_capacity = plVar9[3];
                    local_2e8._0_8_ = psVar1;
                  }
                  else {
                    local_2e8._16_8_ = *psVar2;
                    local_2e8._0_8_ = (size_type *)*plVar9;
                  }
                  local_2e8._8_8_ = plVar9[1];
                  *plVar9 = (long)psVar2;
                  plVar9[1] = 0;
                  *(undefined1 *)(plVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_2c0,(string *)local_2e8);
                  if ((size_type *)local_2e8._0_8_ != psVar1) {
                    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                    operator_delete(local_2b0._M_dataplus._M_p,
                                    local_2b0.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
                ::std::ios_base::~ios_base(local_1a8);
              }
            }
          }
        }
LAB_00215514:
        if ((iVar7 != 3) && (iVar7 != 0)) break;
        p_Var12 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12);
        bVar15 = p_Var12 == local_240;
      } while (!bVar15);
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_280,
             (_Link_type)local_280._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar15;
}

Assistant:

bool ReconstructPrim<DistantLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DistantLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:angle", DistantLight, light->angle)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DistantLight,
                       light->purpose, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DistantLight,
                   light->visibility, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}